

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lira_term.h
# Opt level: O2

LiraTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
* viras::
  LiraTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
  ::analyse(Term<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
            self,Var<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>
                 x)

{
  undefined1 *puVar1;
  anon_class_24_3_77a33212 matchRec;
  Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>
  *in_RCX;
  Var<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>
  *x_00;
  uint64_t in_RDX;
  Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>
  *in_RSI;
  anon_class_8_1_89917c4a_conflict in_RDI;
  TermList in_R8;
  WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>,_Kernel::TermList>
  WVar2;
  LiraTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
  rec1;
  LiraTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
  rec0;
  undefined1 local_2b0 [24];
  undefined1 local_298 [8];
  RationalConstantType local_290;
  anon_class_24_3_77a33212 local_270;
  LiraTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
  *local_258;
  LiraTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
  *pLStack_250;
  Term<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
  *local_248;
  LiraTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
  *local_240;
  mp_limb_t *pmStack_238;
  LiraTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
  *local_230;
  Term<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
  local_228;
  LiraTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
  local_218;
  LiraTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
  local_120;
  
  local_2b0._0_8_ = in_RCX;
  local_2b0._8_8_ = in_R8._content;
  local_228.
  super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>,_Kernel::TermList>
  .config = in_RSI;
  local_228.
  super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>,_Kernel::TermList>
  .inner._content = in_RDX;
  LiraTerm(&local_120);
  LiraTerm(&local_218);
  pmStack_238 = (mp_limb_t *)local_2b0;
  local_240 = &local_120;
  local_230 = &local_218;
  matchTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>>,viras::DefaultOpts>,viras::LiraTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>>,viras::DefaultOpts>>::analyse(viras::Term<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>>,viras::DefaultOpts>>,viras::Var<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>>,viras::DefaultOpts>>)::_lambda(auto:1)_1_,viras::LiraTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>>,viras::DefaultOpts>>::analyse(viras::Term<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>>,viras::DefaultOpts>>,viras::Var<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>>,viras::DefaultOpts>>)::_lambda()_1_,viras::LiraTerm<viras::Con___eVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>>,viras::DefaultOpts>>____lambda_auto_1__2_>
            ();
  LiraTerm(in_RDI.self);
  ((in_RDI.self)->self).
  super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>,_Kernel::TermList>
  .config = local_228.
            super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>,_Kernel::TermList>
            .config;
  ((in_RDI.self)->self).
  super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>,_Kernel::TermList>
  .inner._content =
       local_228.
       super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>,_Kernel::TermList>
       .inner._content;
  *(undefined4 *)
   &((in_RDI.self)->x).
    super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>,_Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>::VarWrapper>
    .config = local_2b0._0_4_;
  *(undefined4 *)
   ((long)&((in_RDI.self)->x).
           super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>,_Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>::VarWrapper>
           .config + 4) = local_2b0._4_4_;
  *(undefined4 *)
   &((in_RDI.self)->x).
    super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>,_Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>::VarWrapper>
    .inner.super_TermList._content = local_2b0._8_4_;
  *(undefined4 *)
   ((long)&((in_RDI.self)->x).
           super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>,_Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>::VarWrapper>
           .inner.super_TermList._content + 4) = local_2b0._12_4_;
  puVar1 = local_2b0 + 0x10;
  local_270.rec0 = &local_120;
  local_270.rec1 = &local_218;
  local_270.self = &local_228;
  analyse::anon_class_24_3_77a33212::
  operator()<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_viras_src_viras_lira_term_h:140:21),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_viras_src_viras_lira_term_h:143:25),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_viras_src_viras_lira_term_h:146:21),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_viras_src_viras_lira_term_h:149:21),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_viras_src_viras_lira_term_h:154:25)>
            (local_298,&local_270,puVar1,puVar1,puVar1);
  WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>,_Kernel::RealConstantType>
  ::operator=(&((in_RDI.self)->per).
               super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>,_Kernel::RealConstantType>
              ,(WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>,_Kernel::RealConstantType>
                *)local_298);
  Kernel::RationalConstantType::~RationalConstantType(&local_290);
  local_298 = (undefined1  [8])&local_120;
  local_290._num._val[0]._0_8_ = &local_218;
  local_290._num._val[0]._mp_d = (mp_limb_t *)&local_228;
  WVar2 = (WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>,_Kernel::TermList>
           )analyse::anon_class_24_3_77a33212::
            operator()<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_viras_src_viras_lira_term_h:116:21),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_viras_src_viras_lira_term_h:119:25),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_viras_src_viras_lira_term_h:122:21),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_viras_src_viras_lira_term_h:125:21),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_viras_src_viras_lira_term_h:128:25)>
                      ((anon_class_24_3_77a33212 *)local_298,in_RDI,in_RDI,in_RDI,in_RDI,in_RDI);
  ((in_RDI.self)->lim).
  super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>,_Kernel::TermList>
       = WVar2;
  puVar1 = local_2b0 + 0x10;
  local_270.rec0 = &local_120;
  local_270.rec1 = &local_218;
  local_270.self = &local_228;
  analyse::anon_class_24_3_77a33212::
  operator()<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_viras_src_viras_lira_term_h:165:21),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_viras_src_viras_lira_term_h:168:27),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_viras_src_viras_lira_term_h:171:23),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_viras_src_viras_lira_term_h:174:23),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_viras_src_viras_lira_term_h:177:25)>
            (local_298,&local_270,puVar1,local_2b0,puVar1,puVar1);
  WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>,_Kernel::RealConstantType>
  ::operator=(&((in_RDI.self)->sslp).
               super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>,_Kernel::RealConstantType>
              ,(WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>,_Kernel::RealConstantType>
                *)local_298);
  Kernel::RationalConstantType::~RationalConstantType(&local_290);
  x_00 = (Var<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>
          *)local_2b0;
  local_270.rec0 = &local_120;
  local_270.rec1 = &local_218;
  local_270.self = &local_228;
  analyse::anon_class_24_3_77a33212::
  operator()<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_viras_src_viras_lira_term_h:187:21),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_viras_src_viras_lira_term_h:190:27),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_viras_src_viras_lira_term_h:193:23),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_viras_src_viras_lira_term_h:196:23),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_viras_src_viras_lira_term_h:199:25)>
            (local_298);
  WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>,_Kernel::RealConstantType>
  ::operator=(&((in_RDI.self)->oslp).
               super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>,_Kernel::RealConstantType>
              ,(WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>,_Kernel::RealConstantType>
                *)local_298);
  Kernel::RationalConstantType::~RationalConstantType(&local_290);
  matchRec.rec1._0_4_ = (int)&local_218;
  matchRec.rec0 = &local_120;
  matchRec.rec1._4_4_ = (int)((ulong)&local_218 >> 0x20);
  matchRec.self = &local_228;
  local_258 = &local_120;
  pLStack_250 = &local_218;
  local_248 = &local_228;
  LiraTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>>,viras::DefaultOpts>>
  ::
  calcDeltaY<viras::LiraTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>>,viras::DefaultOpts>>::analyse(viras::Term<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>>,viras::DefaultOpts>>,viras::Var<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>>,viras::DefaultOpts>>)::_lambda(auto:1,auto:2,auto:3,auto:4,auto:5)_1_>
            ((Numeral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
              *)local_298,
             (LiraTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>>,viras::DefaultOpts>>
              *)in_RDI.self,
             (LiraTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
              *)local_2b0,x_00,matchRec);
  WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>,_Kernel::RealConstantType>
  ::operator=(&((in_RDI.self)->deltaY).
               super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>,_Kernel::RealConstantType>
              ,(WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>,_Kernel::RealConstantType>
                *)local_298);
  Kernel::RationalConstantType::~RationalConstantType(&local_290);
  local_298 = (undefined1  [8])&local_120;
  local_290._num._val[0]._0_8_ = &local_218;
  local_290._num._val[0]._mp_d = (mp_limb_t *)&local_228;
  WVar2 = (WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>,_Kernel::TermList>
           )analyse::anon_class_24_3_77a33212::
            operator()<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_viras_src_viras_lira_term_h:235:21),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_viras_src_viras_lira_term_h:238:27),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_viras_src_viras_lira_term_h:241:23),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_viras_src_viras_lira_term_h:244:23),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_viras_src_viras_lira_term_h:247:25)>
                      ((anon_class_24_3_77a33212 *)local_298,local_2b0,&local_270,&local_270,
                       local_2b0);
  ((in_RDI.self)->distYminus).
  super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>,_Kernel::TermList>
       = WVar2;
  local_298 = (undefined1  [8])&local_120;
  local_290._num._val[0]._0_8_ = &local_218;
  local_290._num._val[0]._mp_d = (mp_limb_t *)&local_228;
  analyse::anon_class_24_3_77a33212::
  operator()<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_viras_src_viras_lira_term_h:261:21),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_viras_src_viras_lira_term_h:264:27),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_viras_src_viras_lira_term_h:267:23),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_viras_src_viras_lira_term_h:270:23),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_viras_src_viras_lira_term_h:276:25)>
            (&local_270);
  std::
  vector<viras::Break<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>,_std::allocator<viras::Break<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>_>_>
  ::_M_move_assign((vector<viras::Break<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>,_std::allocator<viras::Break<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>_>_>
                    *)&(in_RDI.self)->breaks,&local_270);
  std::
  vector<viras::Break<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>,_std::allocator<viras::Break<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>_>_>
  ::~vector((vector<viras::Break<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>,_std::allocator<viras::Break<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>_>_>
             *)&local_270);
  ~LiraTerm(&local_218);
  ~LiraTerm(&local_120);
  return in_RDI.self;
}

Assistant:

static LiraTerm analyse(Term<C> self, Var<C> x) {
      LiraTerm rec0;
      LiraTerm rec1;
      matchTerm(self, 
        /* var v */ [&](auto y) { return std::make_tuple(); }, 
        /* numeral 1 */ [&]() { return std::make_tuple(); }, 
        /* k * t */ [&](auto k, auto t) { 
          rec0 = analyse(t, x);
          return std::make_tuple();
        }, 

        /* l + r */ [&](auto l, auto r) { 
          rec0 = analyse(l, x);
          rec1 = analyse(r, x);
          return std::make_tuple();
        }, 

        /* floor */ [&](auto t) { 
          rec0 = analyse(t, x);
          return std::make_tuple();
        });
      auto matchRec = [&](auto if_var, auto if_one, auto if_mul, auto if_add, auto if_floor) {
        return matchTerm(self, 
        /* var v */ if_var,
        /* numeral 1 */ if_one,
        /* k * t */ [&](auto k, auto t) { return if_mul(k, t, rec0); }, 
        /* l + r */ [&](auto l, auto r) { return if_add(l, r, rec0, rec1); }, 
        /* floor */ [&](auto t) { return if_floor(t, rec0); });
      };
      LiraTerm res;
      res.self = self;
      res.x = x;
      res.per = calcPer(res, x, matchRec);
      res.lim = calcLim(res, x, matchRec);
      res.sslp = calcSslp(res, x, matchRec);
      res.oslp = calcOslp(res, x, matchRec);
      res.deltaY = calcDeltaY(res, x, matchRec);
      res.distYminus = calcDistYminus(res, x, matchRec);
      res.breaks = calcBreaks(res, x, matchRec);
      
#define DEBUG_FIELD(lvl, field)                                                                \
        VIRAS_LOG(lvl, "analyse(", res.self, ")." #field " = ", res.field)
        // DEBUG_FIELD(breaks.size())
        // iter::array(res.breaks) | iter::dbg("break") | iter::foreach([](auto...){});
        // DEBUG_FIELD(per)
        // DEBUG_FIELD(deltaY)

        if (x.config->opts.optimizeBounds()) {
          VIRAS_ASSERT(res.per != 0 || res.deltaY == 0);
        }
        VIRAS_ASSERT((res.per == 0) == (res.breaks.size() == 0));
        return res;
    }